

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  void *pvVar1;
  reference ppvVar2;
  
  DeallocateCustomSizedSlabs(this);
  *(undefined4 *)(this + 0x48) = 0;
  if (*(int *)(this + 0x18) != 0) {
    *(undefined8 *)(this + 0x50) = 0;
    ppvVar2 = SmallVectorTemplateCommon<void_*,_void>::front
                        ((SmallVectorTemplateCommon<void_*,_void> *)(this + 0x10));
    pvVar1 = *ppvVar2;
    *(void **)this = pvVar1;
    *(long *)(this + 8) = (long)pvVar1 + 0x1000;
    DeallocateSlabs(this,(iterator)(*(long *)(this + 0x10) + 8),
                    (iterator)(*(long *)(this + 0x10) + (ulong)*(uint *)(this + 0x18) * 8));
    SmallVectorImpl<void_*>::erase
              ((SmallVectorImpl<void_*> *)(this + 0x10),(const_iterator)(*(long *)(this + 0x10) + 8)
               ,(const_iterator)(*(long *)(this + 0x10) + (ulong)*(uint *)(this + 0x18) * 8));
    return;
  }
  return;
}

Assistant:

void Reset() {
    // Deallocate all but the first slab, and deallocate all custom-sized slabs.
    DeallocateCustomSizedSlabs();
    CustomSizedSlabs.clear();

    if (Slabs.empty())
      return;

    // Reset the state.
    BytesAllocated = 0;
    CurPtr = (char *)Slabs.front();
    End = CurPtr + SlabSize;

    __asan_poison_memory_region(*Slabs.begin(), computeSlabSize(0));
    DeallocateSlabs(std::next(Slabs.begin()), Slabs.end());
    Slabs.erase(std::next(Slabs.begin()), Slabs.end());
  }